

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O0

ER __thiscall
slang::ast::DoWhileLoopStatement::evalImpl(DoWhileLoopStatement *this,EvalContext *context)

{
  bool bVar1;
  ConstantValue cv;
  ER result;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  EvalContext *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  int local_58;
  ER local_1c;
  ER local_4;
  
  while( true ) {
    local_1c = Statement::eval((Statement *)in_stack_ffffffffffffff90,
                               (EvalContext *)
                               CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (local_1c != Success) {
      if (local_1c == Break) goto LAB_00a3cbe1;
      if (local_1c != Continue) {
        return local_1c;
      }
    }
    in_stack_ffffffffffffff90 = (EvalContext *)&stack0xffffffffffffffb8;
    Expression::eval((Expression *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                     in_stack_ffffffffffffff90);
    in_stack_ffffffffffffff9f = slang::ConstantValue::bad((ConstantValue *)0xa3cb51);
    if ((bool)in_stack_ffffffffffffff9f) {
      local_4 = Fail;
      local_58 = 1;
    }
    else {
      bVar1 = slang::ConstantValue::isTrue((ConstantValue *)in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff8c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff8c);
      if (bVar1) {
        local_58 = 0;
      }
      else {
        local_58 = 3;
      }
    }
    slang::ConstantValue::~ConstantValue((ConstantValue *)0xa3cbc3);
    if (local_58 != 0) break;
    in_stack_ffffffffffffff88 = 0;
  }
  if (local_58 != 1) {
LAB_00a3cbe1:
    local_4 = Success;
  }
  return local_4;
}

Assistant:

ER DoWhileLoopStatement::evalImpl(EvalContext& context) const {
    while (true) {
        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }

        auto cv = cond.eval(context);
        if (cv.bad())
            return ER::Fail;

        if (!cv.isTrue())
            break;
    }

    return ER::Success;
}